

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O2

QString * __thiscall
QHttpNetworkConnectionPrivate::errorDetail
          (QString *__return_storage_ptr__,QHttpNetworkConnectionPrivate *this,
          NetworkError errorCode,QIODevice *socket,QString *extraDetail)

{
  Data *pDVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  char *pcVar5;
  char *pcVar6;
  QStringBuilder<QLatin1String,_QString> *this_00;
  long in_FS_OFFSET;
  QStringBuilder<QLatin1String,_QString> local_88;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  this_00 = &local_88;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  switch(errorCode) {
  case ConnectionRefusedError:
    pcVar6 = "QHttp";
    pcVar5 = "Connection refused";
    break;
  case RemoteHostClosedError:
    pcVar6 = "QHttp";
    pcVar5 = "Connection closed";
    break;
  case HostNotFoundError:
    local_88.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.a.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.a.m_data = &DAT_aaaaaaaaaaaaaaaa;
    if (socket == (QIODevice *)0x0) {
      local_88.a.m_size = (qsizetype)(this->hostName).d.d;
      local_88.a.m_data = (char *)(this->hostName).d.ptr;
      local_88.b.d.d = (Data *)(this->hostName).d.size;
      if ((Data *)local_88.a.m_size != (Data *)0x0) {
        LOCK();
        (((Data *)local_88.a.m_size)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = (((Data *)local_88.a.m_size)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      QSocketAbstraction::socketPeerName((QString *)&local_88,socket);
    }
    QCoreApplication::translate((char *)&local_60,"QHttp","Host %1 not found",0);
    QString::arg<QString,_true>
              ((QString *)&local_48,(QString *)&local_60,(QString *)&local_88,0,(QChar)0x20);
    pDVar1 = (__return_storage_ptr__->d).d;
    pcVar4 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_48.d;
    (__return_storage_ptr__->d).ptr = local_48.ptr;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_48.size;
    local_48.d = pDVar1;
    local_48.ptr = pcVar4;
    local_48.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    goto LAB_001ea9ee;
  case TimeoutError:
    pcVar6 = "QAbstractSocket";
    pcVar5 = "Socket operation timed out";
    break;
  case OperationCanceledError:
  case TemporaryNetworkFailureError:
  case NetworkSessionFailedError:
  case BackgroundRequestNotAllowedError:
switchD_001ea7f2_caseD_5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QString::operator=(__return_storage_ptr__,(QString *)extraDetail);
      return __return_storage_ptr__;
    }
    goto LAB_001eaab4;
  case SslHandshakeFailedError:
    QCoreApplication::translate((char *)&local_88,"QHttp","SSL handshake failed",0);
    pDVar3 = (__return_storage_ptr__->d).d;
    pcVar4 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)local_88.a.m_size;
    (__return_storage_ptr__->d).ptr = (char16_t *)local_88.a.m_data;
    pDVar1 = (Data *)(__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = (qsizetype)local_88.b.d.d;
    local_88.a.m_size = (qsizetype)pDVar3;
    local_88.a.m_data = (char *)pcVar4;
    local_88.b.d.d = pDVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    if (socket != (QIODevice *)0x0) {
      this_00 = (QStringBuilder<QLatin1String,_QString> *)&local_48;
      QIODevice::errorString();
      local_88.b.d.size = local_48.size;
      local_88.b.d.ptr = local_48.ptr;
      local_88.b.d.d = local_48.d;
      local_88.a.m_size = 2;
      local_88.a.m_data = ": ";
      local_48.d = (Data *)0x0;
      local_48.ptr = (char16_t *)0x0;
      local_48.size = 0;
      ::operator+=(__return_storage_ptr__,&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88.b.d);
      goto LAB_001ea9ee;
    }
    goto LAB_001ea9f3;
  case TooManyRedirectsError:
    pcVar6 = "QHttp";
    pcVar5 = "Too many redirects";
    break;
  case InsecureRedirectError:
    pcVar6 = "QHttp";
    pcVar5 = "Insecure redirect";
    break;
  default:
    if (errorCode == ProxyAuthenticationRequiredError) {
      pcVar6 = "QHttp";
      pcVar5 = "Proxy requires authentication";
    }
    else if (errorCode == AuthenticationRequiredError) {
      pcVar6 = "QHttp";
      pcVar5 = "Host requires authentication";
    }
    else if (errorCode == ProtocolUnknownError) {
      pcVar6 = "QHttp";
      pcVar5 = "Unknown protocol specified";
    }
    else {
      if (errorCode != ProtocolFailure) goto switchD_001ea7f2_caseD_5;
      pcVar6 = "QHttp";
      pcVar5 = "Data corrupted";
    }
  }
  QCoreApplication::translate((char *)&local_88,pcVar6,pcVar5,0);
  pDVar3 = (__return_storage_ptr__->d).d;
  pcVar4 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).d = (Data *)local_88.a.m_size;
  (__return_storage_ptr__->d).ptr = (char16_t *)local_88.a.m_data;
  pDVar1 = (Data *)(__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = (qsizetype)local_88.b.d.d;
  this_00 = &local_88;
  local_88.a.m_size = (qsizetype)pDVar3;
  local_88.a.m_data = (char *)pcVar4;
  local_88.b.d.d = pDVar1;
LAB_001ea9ee:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
LAB_001ea9f3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_001eaab4:
  __stack_chk_fail();
}

Assistant:

QString QHttpNetworkConnectionPrivate::errorDetail(QNetworkReply::NetworkError errorCode, QIODevice *socket, const QString &extraDetail)
{
    QString errorString;
    switch (errorCode) {
    case QNetworkReply::HostNotFoundError: {
        const QString peerName = socket ? QSocketAbstraction::socketPeerName(socket) : hostName;
        errorString = QCoreApplication::translate("QHttp", "Host %1 not found").arg(peerName);
        break;
    }
    case QNetworkReply::ConnectionRefusedError:
        errorString = QCoreApplication::translate("QHttp", "Connection refused");
        break;
    case QNetworkReply::RemoteHostClosedError:
        errorString = QCoreApplication::translate("QHttp", "Connection closed");
        break;
    case QNetworkReply::TimeoutError:
        errorString = QCoreApplication::translate("QAbstractSocket", "Socket operation timed out");
        break;
    case QNetworkReply::ProxyAuthenticationRequiredError:
        errorString = QCoreApplication::translate("QHttp", "Proxy requires authentication");
        break;
    case QNetworkReply::AuthenticationRequiredError:
        errorString = QCoreApplication::translate("QHttp", "Host requires authentication");
        break;
    case QNetworkReply::ProtocolFailure:
        errorString = QCoreApplication::translate("QHttp", "Data corrupted");
        break;
    case QNetworkReply::ProtocolUnknownError:
        errorString = QCoreApplication::translate("QHttp", "Unknown protocol specified");
        break;
    case QNetworkReply::SslHandshakeFailedError:
        errorString = QCoreApplication::translate("QHttp", "SSL handshake failed");
        if (socket)
            errorString += ": "_L1 + socket->errorString();
        break;
    case QNetworkReply::TooManyRedirectsError:
        errorString = QCoreApplication::translate("QHttp", "Too many redirects");
        break;
    case QNetworkReply::InsecureRedirectError:
        errorString = QCoreApplication::translate("QHttp", "Insecure redirect");
        break;
    default:
        // all other errors are treated as QNetworkReply::UnknownNetworkError
        errorString = extraDetail;
        break;
    }
    return errorString;
}